

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1_util.cpp
# Opt level: O3

secp256k1_xonly_pubkey *
cfd::core::ParseXOnlyPubkey(secp256k1_xonly_pubkey *__return_storage_ptr__,SchnorrPubkey *pubkey)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  CfdException *this;
  string local_60;
  ByteData local_40;
  
  ctx = wally_get_secp_context();
  SchnorrPubkey::GetData(&local_40,pubkey);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,&local_40);
  iVar1 = secp256k1_xonly_pubkey_parse
                    (ctx,__return_storage_ptr__,(uchar *)local_60._M_dataplus._M_p);
  if ((uchar *)local_60._M_dataplus._M_p != (uchar *)0x0) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_40.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (iVar1 == 1) {
    return __return_storage_ptr__;
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Could not parse xonly pubkey","");
  CfdException::CfdException(this,kCfdInternalError,&local_60);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

secp256k1_xonly_pubkey ParseXOnlyPubkey(const SchnorrPubkey& pubkey) {
  auto ctx = wally_get_secp_context();
  secp256k1_xonly_pubkey xonly_pubkey;

  auto ret = secp256k1_xonly_pubkey_parse(
      ctx, &xonly_pubkey, pubkey.GetData().GetBytes().data());

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not parse xonly pubkey");
  }

  return xonly_pubkey;
}